

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O3

void test_font_variety(wins *wins_ar,int ar_len,Am_Style *bs,bool invert)

{
  Am_Font_Family_Flag AVar1;
  Am_Font_Size_Flag AVar2;
  long *plVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  Am_Font local_70 [8];
  ulong local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  Am_Style *local_40;
  ulong local_38;
  
  test_string = "Egypt";
  test_str_len = 5;
  local_68 = (ulong)(uint)ar_len;
  local_48 = local_68 << 6;
  local_38 = (ulong)invert;
  lVar10 = 0;
  uVar12 = 0;
  local_40 = bs;
  do {
    AVar1 = test_font_variety::family_array[lVar10];
    uVar9 = 1;
    local_60 = lVar10;
    do {
      AVar2 = test_font_variety::size_array[uVar9];
      bVar8 = false;
      local_58 = uVar9;
      bVar5 = true;
      do {
        bVar6 = bVar5;
        bVar7 = false;
        bVar5 = true;
        do {
          bVar4 = bVar5;
          local_50 = uVar12;
          Am_Font::Am_Font(local_70,AVar1,false,bVar8,bVar7,AVar2);
          Am_Font::operator=((Am_Font *)&test_font,local_70);
          Am_Font::~Am_Font(local_70);
          uVar12 = local_50;
          iVar11 = (int)local_50;
          if (0 < ar_len) {
            lVar10 = 0;
            do {
              plVar3 = *(long **)((long)&wins_ar->font_win + lVar10);
              (**(code **)(*plVar3 + 0xd0))
                        (plVar3,&test_font,test_string,test_str_len,&test_string_width,
                         &test_string_ascent,&test_string_descent,&test_string_left_bearing,
                         &test_string_right_bearing);
              test_string_height = test_string_descent + test_string_ascent;
              (**(code **)(*plVar3 + 0x170))
                        (plVar3,&Am_Black,test_string,test_str_len,&test_font,10,uVar12,0,local_40,
                         local_38);
              lVar13 = local_48;
              (**(code **)(*plVar3 + 0x160))
                        (plVar3,&black,&Am_No_Style,10,uVar12 & 0xffffffff,test_string_width,
                         test_string_height,0);
              lVar10 = lVar10 + 0x40;
            } while (lVar13 != lVar10);
          }
          uVar12 = (ulong)(iVar11 + test_string_height + 4);
          bVar7 = true;
          bVar5 = false;
        } while (bVar4);
        bVar8 = true;
        bVar5 = false;
      } while (bVar6);
      uVar9 = local_58 + 2;
    } while (local_58 < 2);
    lVar10 = local_60 + 1;
  } while (lVar10 != 3);
  if (0 < ar_len) {
    lVar13 = local_68 << 6;
    lVar10 = 0;
    do {
      (**(code **)(**(long **)((long)&wins_ar->font_win + lVar10) + 0xa0))();
      lVar10 = lVar10 + 0x40;
    } while (lVar13 != lVar10);
  }
  return;
}

Assistant:

void
test_font_variety(wins *wins_ar, int ar_len, Am_Style &bs, bool invert)
{
  // Since family_array and size_array are static, they persists across
  // multiple invocations of the enclosing function.  They will not be
  // reinitialized when the function is invoked a second time.
  static Am_Font_Family_Flag family_array[3] = {Am_FONT_FIXED, Am_FONT_SERIF,
                                                Am_FONT_SANS_SERIF};
  static Am_Font_Size_Flag size_array[4] = {Am_FONT_SMALL, Am_FONT_MEDIUM,
                                            Am_FONT_LARGE, Am_FONT_VERY_LARGE};
  int top = 0;
  test_string = "Egypt";
  test_str_len = 5;
  for (int fam = 0; fam < 3; fam++) {
    for (int size = 1; size < 4; size += 2) {
      for (int it = 0; it < 2; it++) {
        for (int under = 0; under < 2; under++) {
          test_font =
              Am_Font(family_array[fam], false, it, under, size_array[size]);

          for (int i = 0; i < ar_len; i++) {
            Am_Drawonable *font_win = wins_ar[i].font_win;
            update_font_numbers(font_win);

            font_win->Draw_Text(Am_Black, test_string, test_str_len, test_font,
                                10, top, Am_DRAW_COPY, bs, invert);
            font_win->Draw_Rectangle(black, Am_No_Style, 10, top,
                                     test_string_width, test_string_height);
          }
          top = top + test_string_height + 4;
        }
      }
    }
  }
  for (int i = 0; i < ar_len; i++) {
    (wins_ar[i].font_win)->Flush_Output();
  }
}